

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O0

int recvsimplehttpresp(SOCKET sock,int *pStatus,char **pszStatus,char **pContentType,
                      int *pContentLength,char **pContent,int maxrecvbuflen,int *pBytesReceived)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  undefined8 local_68;
  double httpver;
  char *pcStack_58;
  int count;
  char *ptr2;
  char *ptr;
  char *recvbuf;
  char **ppcStack_38;
  int ret;
  char **pContent_local;
  int *pContentLength_local;
  char **pContentType_local;
  char **pszStatus_local;
  int *pStatus_local;
  SOCKET sock_local;
  
  recvbuf._4_4_ = 1;
  ptr = (char *)0x0;
  ptr2 = (char *)0x0;
  pcStack_58 = (char *)0x0;
  httpver._4_4_ = 0;
  local_68 = 0;
  *pStatus = 0;
  *pszStatus = (char *)0x0;
  *pContentType = (char *)0x0;
  *pContentLength = 0;
  *pContent = (char *)0x0;
  *pBytesReceived = 0;
  ppcStack_38 = pContent;
  pContent_local = (char **)pContentLength;
  pContentLength_local = (int *)pContentType;
  pContentType_local = pszStatus;
  pszStatus_local = (char **)pStatus;
  pStatus_local._0_4_ = sock;
  ptr = (char *)calloc((long)(maxrecvbuflen + 1),1);
  if (ptr == (char *)0x0) {
    pStatus_local._4_4_ = 6;
  }
  else {
    recvbuf._4_4_ = recvuntilstr((SOCKET)pStatus_local,ptr,"\r\n\r\n",maxrecvbuflen,pBytesReceived);
    if (recvbuf._4_4_ == 0) {
      ptr2 = strstr(ptr,"HTTP/");
      if (ptr2 == (char *)0x0) {
        free(ptr);
        pStatus_local._4_4_ = 4;
      }
      else {
        pcVar2 = (char *)calloc(0x100,1);
        *pContentType_local = pcVar2;
        if (*pContentType_local == (char *)0x0) {
          free(ptr);
          pStatus_local._4_4_ = 6;
        }
        else {
          iVar1 = __isoc99_sscanf(ptr2,"HTTP/%lf %d %[^\r\n]255s",&local_68,pszStatus_local,
                                  *pContentType_local);
          if (iVar1 == 3) {
            pcVar2 = strstrbeginend(ptr2,"Content-Type: ","\r\n",&stack0xffffffffffffffa8,
                                    (int *)((long)&httpver + 4));
            if (pcVar2 == (char *)0x0) {
              free(*pContentType_local);
              free(ptr);
              pStatus_local._4_4_ = 4;
            }
            else {
              pvVar3 = calloc((long)(httpver._4_4_ + 1),1);
              *(void **)pContentLength_local = pvVar3;
              if (*(long *)pContentLength_local == 0) {
                free(*pContentType_local);
                free(ptr);
                pStatus_local._4_4_ = 6;
              }
              else {
                memcpy(*(void **)pContentLength_local,pcStack_58,(long)httpver._4_4_);
                ptr2 = strstr(ptr,"Content-Length: ");
                if (ptr2 == (char *)0x0) {
                  free(*(void **)pContentLength_local);
                  free(*pContentType_local);
                  free(ptr);
                  pStatus_local._4_4_ = 0;
                }
                else {
                  iVar1 = __isoc99_sscanf(ptr2,"Content-Length: %d",pContent_local);
                  if ((iVar1 == 1) && (-1 < *(int *)pContent_local)) {
                    free(ptr);
                    pcVar2 = (char *)calloc((long)(*(int *)pContent_local + 1),1);
                    *ppcStack_38 = pcVar2;
                    if (*ppcStack_38 == (char *)0x0) {
                      free(*(void **)pContentLength_local);
                      free(*pContentType_local);
                      pStatus_local._4_4_ = 6;
                    }
                    else {
                      recvbuf._4_4_ =
                           recvall((SOCKET)pStatus_local,*ppcStack_38,*(int *)pContent_local);
                      if (recvbuf._4_4_ == 0) {
                        *pBytesReceived = *(int *)pContent_local + *pBytesReceived;
                        pStatus_local._4_4_ = 0;
                      }
                      else {
                        free(*ppcStack_38);
                        free(*(void **)pContentLength_local);
                        free(*pContentType_local);
                        pStatus_local._4_4_ = recvbuf._4_4_;
                      }
                    }
                  }
                  else {
                    free(*(void **)pContentLength_local);
                    free(*pContentType_local);
                    free(ptr);
                    pStatus_local._4_4_ = 4;
                  }
                }
              }
            }
          }
          else {
            free(*pContentType_local);
            free(ptr);
            pStatus_local._4_4_ = 4;
          }
        }
      }
    }
    else {
      free(ptr);
      pStatus_local._4_4_ = recvbuf._4_4_;
    }
  }
  return pStatus_local._4_4_;
}

Assistant:

inline int recvsimplehttpresp(SOCKET sock, int* pStatus, char** pszStatus, char** pContentType, int* pContentLength, char** pContent, int maxrecvbuflen, int* pBytesReceived)
{
	int ret = EXIT_FAILURE;
	char* recvbuf = NULL;
	char* ptr = NULL;
	char* ptr2 = NULL;
	int count = 0;
	double httpver = 0;

	*pStatus = 0;
	*pszStatus = NULL;
	*pContentType = NULL;
	*pContentLength = 0;
	*pContent = NULL;
	*pBytesReceived = 0;

	recvbuf = (char*)calloc(maxrecvbuflen+1, 1);
	if (recvbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		return EXIT_OUT_OF_MEMORY;
	}

	// Should enable other line endings...

	ret = recvuntilstr(sock, recvbuf, "\r\n\r\n", maxrecvbuflen, pBytesReceived);
	if (ret != EXIT_SUCCESS)
	{
		free(recvbuf);
		return ret;
	}

	ptr = strstr(recvbuf, "HTTP/");
	if (ptr == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pszStatus = (char*)calloc(256, 1);
	if (*pszStatus == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	if (sscanf(ptr, "HTTP/%lf %d %[^\r\n]255s", &httpver, pStatus, *pszStatus) != 3)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	if (strstrbeginend(ptr, "Content-Type: ", "\r\n", &ptr2, &count) == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}

	*pContentType = (char*)calloc(count+1, 1);
	if (*pContentType == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pszStatus);
		free(recvbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(*pContentType, ptr2, count);

	ptr = strstr(recvbuf, "Content-Length: ");
	if (ptr == NULL)
	{
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_SUCCESS;
	}
	
	if ((sscanf(ptr, "Content-Length: %d", pContentLength) != 1)||(*pContentLength < 0))
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_DATA],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		free(recvbuf);
		return EXIT_INVALID_DATA;
	}
	
	free(recvbuf);

	*pContent = (char*)calloc(*pContentLength+1, 1);
	if (*pContent == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("recvsimplehttpresp error (%s) : %s"
			"(sock=%d, *pStatus=%d, *pszStatus=%s, *pContentType=%s, *pContentLength=%d, *pContent=%#x, maxrecvbuflen=%d, *pBytesReceived=%d)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, *pStatus, *pszStatus, *pContentType, *pContentLength, *pContent, maxrecvbuflen, *pBytesReceived));
		free(*pContentType);
		free(*pszStatus);
		return EXIT_OUT_OF_MEMORY;
	}

	ret = recvall(sock, *pContent, *pContentLength);
	if (ret != EXIT_SUCCESS)
	{
		free(*pContent);
		free(*pContentType);
		free(*pszStatus);
		return ret;
	}

	*pBytesReceived += *pContentLength;

	return EXIT_SUCCESS;
}